

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trend_suite.cpp
# Opt level: O1

void double_suite::test_linear_decrease(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  double *in_stack_ffffffffffffffb8;
  double local_40;
  char local_38 [8];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '$';
  local_38[7] = '@';
  local_40 = 10.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x61,0x105183,local_38,&local_40,in_stack_ffffffffffffffb8,predicate);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\"';
  local_38[7] = '@';
  local_40 = 9.0;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","9.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x63,0x105183,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_00);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = ' ';
  local_38[7] = '@';
  local_40 = 8.0;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","8.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x65,0x105183,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_01);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\x1c';
  local_38[7] = '@';
  local_40 = 7.0;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","7.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x67,0x105183,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_02);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\x18';
  local_38[7] = '@';
  local_40 = 6.0;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x69,0x105183,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_03);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\x14';
  local_38[7] = '@';
  local_40 = 5.0;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x6b,0x105183,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_04);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\x10';
  local_38[7] = '@';
  local_40 = 4.0;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","4.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x6d,0x105183,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_05);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\b';
  local_38[7] = '@';
  local_40 = 3.0;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x6f,0x105183,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_06);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '@';
  local_40 = 2.0;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x71,0x105183,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_07);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = -0x10;
  local_38[7] = '?';
  local_40 = 1.0;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x73,0x105183,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_08);
  return;
}

Assistant:

void test_linear_decrease()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::trend<double> filter;

    filter.push(10.0);
    TRIAL_TEST_WITH(filter.value(), 10.0, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.value(), 9.0, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.value(), 8.0, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.value(), 7.0, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.value(), 6.0, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.value(), 5.0, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.value(), 4.0, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.value(), 3.0, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 2.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
}